

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void empty_opendir_cb(uv_fs_t *req)

{
  char *__s1;
  int iVar1;
  undefined8 uVar2;
  uv_fs_t *puVar3;
  void *unaff_RBX;
  void *pvVar4;
  uv_fs_t *puVar5;
  long lVar6;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_988 [448];
  uv_fs_t *puStack_7c8;
  long lStack_7b8;
  long lStack_7b0;
  uv_fs_t *apuStack_7a8 [56];
  undefined8 auStack_5e8 [56];
  undefined8 auStack_428 [11];
  uv_fs_t *puStack_3d0;
  undefined1 auStack_268 [448];
  uv_fs_t *puStack_a8;
  undefined1 auStack_58 [56];
  code *pcStack_20;
  void *local_18;
  ssize_t local_10;
  
  pvVar4 = opendir_req.ptr;
  if (req == &opendir_req) {
    local_10 = (ssize_t)opendir_req.fs_type;
    local_18 = (void *)0x1f;
    if (local_10 != 0x1f) goto LAB_0018b92b;
    local_10 = opendir_req.result;
    local_18 = (void *)0x0;
    if (opendir_req.result != 0) goto LAB_0018b938;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0018b945;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)pvVar4 + 8) = 1;
    pcStack_20 = (code *)0x18b8db;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x18b8f4;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,pvVar4,empty_readdir_cb);
    local_10 = (ssize_t)iVar1;
    local_18 = (void *)0x0;
    if (local_10 == 0) {
      pcStack_20 = (code *)0x18b91a;
      uv_fs_req_cleanup(&opendir_req);
      empty_opendir_cb_count = empty_opendir_cb_count + 1;
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x18b92b;
    empty_opendir_cb_cold_1();
LAB_0018b92b:
    pcStack_20 = (code *)0x18b938;
    empty_opendir_cb_cold_2();
LAB_0018b938:
    pcStack_20 = (code *)0x18b945;
    empty_opendir_cb_cold_3();
    pvVar4 = unaff_RBX;
LAB_0018b945:
    pcStack_20 = (code *)0x18b94a;
    empty_opendir_cb_cold_5();
  }
  pcStack_20 = run_test_fs_readdir_non_existing_dir;
  empty_opendir_cb_cold_4();
  auStack_58._32_8_ = (void *)0x18b975;
  pcStack_20 = (code *)pvVar4;
  memset(&opendir_req,0xdb,0x1c0);
  auStack_58._32_8_ = (void *)0x18b97a;
  uVar2 = uv_default_loop();
  auStack_58._32_8_ = (void *)0x18b98e;
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"./non-existing-dir/",0);
  auStack_58._48_8_ = SEXT48(iVar1);
  auStack_58._40_8_ = (void *)0xfffffffffffffffe;
  if ((void *)auStack_58._48_8_ == (void *)0xfffffffffffffffe) {
    auStack_58._48_8_ = SEXT48(opendir_req.fs_type);
    auStack_58._40_8_ = (void *)0x1f;
    if ((void *)auStack_58._48_8_ != (void *)0x1f) goto LAB_0018bb36;
    auStack_58._48_8_ = opendir_req.result;
    auStack_58._40_8_ = (void *)0xfffffffffffffffe;
    if (opendir_req.result != -2) goto LAB_0018bb43;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0018bb50;
    auStack_58._32_8_ = (void *)0x18ba11;
    uv_fs_req_cleanup(&opendir_req);
    auStack_58._32_8_ = (void *)0x18ba23;
    memset(&opendir_req,0xdb,0x1c0);
    auStack_58._32_8_ = (void *)0x18ba28;
    uVar2 = uv_default_loop();
    auStack_58._32_8_ = (void *)0x18ba41;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
    auStack_58._48_8_ = SEXT48(iVar1);
    auStack_58._40_8_ = (void *)0x0;
    if ((void *)auStack_58._48_8_ != (void *)0x0) goto LAB_0018bb55;
    auStack_58._48_8_ = SEXT48(non_existing_opendir_cb_count);
    auStack_58._40_8_ = (void *)0x0;
    if ((void *)auStack_58._48_8_ != (void *)0x0) goto LAB_0018bb62;
    auStack_58._32_8_ = (void *)0x18ba87;
    uVar2 = uv_default_loop();
    auStack_58._32_8_ = (void *)0x18ba91;
    iVar1 = uv_run(uVar2,0);
    auStack_58._48_8_ = SEXT48(iVar1);
    auStack_58._40_8_ = (void *)0x0;
    if ((void *)auStack_58._48_8_ != (void *)0x0) goto LAB_0018bb6f;
    auStack_58._48_8_ = (void *)0x1;
    auStack_58._40_8_ = SEXT48(non_existing_opendir_cb_count);
    if ((void *)auStack_58._40_8_ != (void *)0x1) goto LAB_0018bb7c;
    auStack_58._32_8_ = (void *)0x18bad7;
    puVar3 = (uv_fs_t *)uv_default_loop();
    auStack_58._32_8_ = (void *)0x18baeb;
    uv_walk(puVar3,close_walk_cb,0);
    auStack_58._32_8_ = (void *)0x18baf5;
    uv_run(puVar3,0);
    auStack_58._48_8_ = (void *)0x0;
    auStack_58._32_8_ = (void *)0x18bb03;
    uVar2 = uv_default_loop();
    auStack_58._32_8_ = (void *)0x18bb0b;
    iVar1 = uv_loop_close(uVar2);
    auStack_58._40_8_ = SEXT48(iVar1);
    if (auStack_58._48_8_ == auStack_58._40_8_) {
      auStack_58._32_8_ = (void *)0x18bb21;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStack_58._32_8_ = (void *)0x18bb36;
    run_test_fs_readdir_non_existing_dir_cold_1();
LAB_0018bb36:
    auStack_58._32_8_ = (void *)0x18bb43;
    run_test_fs_readdir_non_existing_dir_cold_2();
LAB_0018bb43:
    auStack_58._32_8_ = (void *)0x18bb50;
    run_test_fs_readdir_non_existing_dir_cold_3();
LAB_0018bb50:
    auStack_58._32_8_ = (void *)0x18bb55;
    run_test_fs_readdir_non_existing_dir_cold_4();
LAB_0018bb55:
    auStack_58._32_8_ = (void *)0x18bb62;
    run_test_fs_readdir_non_existing_dir_cold_5();
LAB_0018bb62:
    auStack_58._32_8_ = (void *)0x18bb6f;
    run_test_fs_readdir_non_existing_dir_cold_6();
LAB_0018bb6f:
    auStack_58._32_8_ = (void *)0x18bb7c;
    run_test_fs_readdir_non_existing_dir_cold_7();
LAB_0018bb7c:
    puVar3 = &opendir_req;
    auStack_58._32_8_ = (void *)0x18bb89;
    run_test_fs_readdir_non_existing_dir_cold_8();
  }
  puVar5 = (uv_fs_t *)(auStack_58 + 0x30);
  auStack_58._32_8_ = non_existing_opendir_cb;
  run_test_fs_readdir_non_existing_dir_cold_9();
  if (puVar5 == &opendir_req) {
    auStack_58._32_8_ = SEXT48(opendir_req.fs_type);
    auStack_58._24_8_ = (void *)0x1f;
    if ((code *)auStack_58._32_8_ != (code *)0x1f) goto LAB_0018bc10;
    auStack_58._32_8_ = opendir_req.result;
    auStack_58._24_8_ = (void *)0xfffffffffffffffe;
    if (opendir_req.result != -2) goto LAB_0018bc1f;
    if (opendir_req.ptr == (void *)0x0) {
      auStack_58._8_8_ = (uv_loop_t *)0x18bc00;
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return;
    }
  }
  else {
    auStack_58._8_8_ = (uv_loop_t *)0x18bc10;
    non_existing_opendir_cb_cold_1();
LAB_0018bc10:
    auStack_58._8_8_ = (uv_loop_t *)0x18bc1f;
    non_existing_opendir_cb_cold_2();
LAB_0018bc1f:
    auStack_58._8_8_ = (uv_loop_t *)0x18bc2e;
    non_existing_opendir_cb_cold_3();
  }
  auStack_58._8_8_ = run_test_fs_readdir_file;
  non_existing_opendir_cb_cold_4();
  auStack_58._8_8_ = puVar3;
  memset(&opendir_req,0xdb,0x1c0);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",0);
  auStack_58._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_58._0_8_ == (void *)0xffffffffffffffec) {
    auStack_58._0_8_ = SEXT48(opendir_req.fs_type);
    if ((void *)auStack_58._0_8_ != (void *)0x1f) goto LAB_0018be12;
    auStack_58._0_8_ = opendir_req.result;
    if (opendir_req.result != -0x14) goto LAB_0018be1f;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0018be2c;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1c0);
    uVar2 = uv_default_loop();
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    auStack_58._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_58._0_8_ != (void *)0x0) goto LAB_0018be31;
    auStack_58._0_8_ = SEXT48(file_opendir_cb_count);
    if ((void *)auStack_58._0_8_ != (void *)0x0) goto LAB_0018be3e;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    auStack_58._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_58._0_8_ != (void *)0x0) goto LAB_0018be4b;
    auStack_58._0_8_ = (void *)0x1;
    if (file_opendir_cb_count != 1) goto LAB_0018be58;
    puVar3 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar3,close_walk_cb,0);
    uv_run(puVar3,0);
    auStack_58._0_8_ = (void *)0x0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if ((void *)auStack_58._0_8_ == (void *)(long)iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0018be12:
    run_test_fs_readdir_file_cold_2();
LAB_0018be1f:
    run_test_fs_readdir_file_cold_3();
LAB_0018be2c:
    run_test_fs_readdir_file_cold_4();
LAB_0018be31:
    run_test_fs_readdir_file_cold_5();
LAB_0018be3e:
    run_test_fs_readdir_file_cold_6();
LAB_0018be4b:
    run_test_fs_readdir_file_cold_7();
LAB_0018be58:
    puVar3 = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  puVar5 = (uv_fs_t *)auStack_58;
  run_test_fs_readdir_file_cold_9();
  if (puVar5 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0018beec;
    if (opendir_req.result != -0x14) goto LAB_0018befb;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0018beec:
    file_opendir_cb_cold_2();
LAB_0018befb:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_7c8 = (uv_fs_t *)0x18bf25;
  puStack_a8 = puVar3;
  cleanup_test_files();
  puStack_7c8 = (uv_fs_t *)0x18bf2a;
  uVar2 = uv_default_loop();
  puStack_7c8 = (uv_fs_t *)0x18bf49;
  iVar1 = uv_fs_mkdir(uVar2,auStack_268,"test_dir",0x1ed,0);
  apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
  auStack_428[0] = 0;
  if (apuStack_7a8[0] == (uv_fs_t *)0x0) {
    puStack_7c8 = (uv_fs_t *)0x18bf74;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18bf99;
    iVar1 = uv_fs_open(uVar2,auStack_428,"test_dir/file1",0x41,0x180,0);
    puVar5 = puStack_3d0;
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    auStack_5e8[0] = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c580;
    apuStack_7a8[0] = puStack_3d0;
    auStack_5e8[0] = 0;
    if ((long)puStack_3d0 < 0) goto LAB_0018c592;
    puStack_7c8 = (uv_fs_t *)0x18bff8;
    uv_fs_req_cleanup(auStack_428);
    puStack_7c8 = (uv_fs_t *)0x18bffd;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c011;
    iVar1 = uv_fs_close(uVar2,auStack_5e8,(ulong)puVar5 & 0xffffffff,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5a4;
    puStack_7c8 = (uv_fs_t *)0x18c03e;
    uv_fs_req_cleanup(auStack_5e8);
    puStack_7c8 = (uv_fs_t *)0x18c043;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c068;
    iVar1 = uv_fs_open(uVar2,auStack_428,"test_dir/file2",0x41,0x180,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5b3;
    apuStack_7a8[0] = puStack_3d0;
    lStack_7b8 = 0;
    puVar5 = puStack_3d0;
    if ((long)puStack_3d0 < 0) goto LAB_0018c5c2;
    puStack_7c8 = (uv_fs_t *)0x18c0bb;
    uv_fs_req_cleanup(auStack_428);
    puStack_7c8 = (uv_fs_t *)0x18c0c0;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c0d4;
    iVar1 = uv_fs_close(uVar2,auStack_5e8,(ulong)puStack_3d0 & 0xffffffff,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5d1;
    puStack_7c8 = (uv_fs_t *)0x18c101;
    uv_fs_req_cleanup(auStack_5e8);
    puStack_7c8 = (uv_fs_t *)0x18c106;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c125;
    iVar1 = uv_fs_mkdir(uVar2,auStack_268,"test_dir/test_subdir",0x1ed,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5e0;
    puStack_7c8 = (uv_fs_t *)0x18c152;
    uv_fs_req_cleanup(auStack_268);
    puVar5 = &opendir_req;
    puStack_7c8 = (uv_fs_t *)0x18c16b;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_7c8 = (uv_fs_t *)0x18c170;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c184;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",0);
    puVar3 = (uv_fs_t *)opendir_req.ptr;
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5ef;
    apuStack_7a8[0] = (uv_fs_t *)(long)opendir_req.fs_type;
    lStack_7b8 = 0x1f;
    if (apuStack_7a8[0] != (uv_fs_t *)0x1f) goto LAB_0018c5fe;
    apuStack_7a8[0] = (uv_fs_t *)opendir_req.result;
    lStack_7b8 = 0;
    if (opendir_req.result != 0) goto LAB_0018c60d;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0018c61c;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar3 + 8) = 1;
    puStack_7c8 = (uv_fs_t *)0x18c21c;
    uv_fs_req_cleanup(&opendir_req);
    puStack_7c8 = (uv_fs_t *)0x18c221;
    uVar2 = uv_default_loop();
    lVar6 = 0;
    puStack_7c8 = (uv_fs_t *)0x18c238;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,puVar3,0);
    if (iVar1 != 0) {
      lVar6 = 0;
      do {
        __s1 = dirents[0].name;
        puStack_7c8 = (uv_fs_t *)0x18c26a;
        iVar1 = strcmp(dirents[0].name,"file1");
        if (iVar1 != 0) {
          puStack_7c8 = (uv_fs_t *)0x18c27d;
          iVar1 = strcmp(__s1,"file2");
          if (iVar1 == 0) goto LAB_0018c294;
          puStack_7c8 = (uv_fs_t *)0x18c28c;
          iVar1 = strcmp(__s1,"test_subdir");
          if (iVar1 == 0) goto LAB_0018c294;
LAB_0018c55a:
          puStack_7c8 = (uv_fs_t *)0x18c55f;
          run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0018c55f:
          puStack_7c8 = (uv_fs_t *)0x18c56e;
          run_test_fs_readdir_non_empty_dir_cold_12();
          goto LAB_0018c56e;
        }
LAB_0018c294:
        puStack_7c8 = (uv_fs_t *)0x18c29f;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) {
          apuStack_7a8[0] = (uv_fs_t *)(ulong)dirents[0].type;
          lStack_7b8 = 2;
          if (apuStack_7a8[0] == (uv_fs_t *)0x2) goto LAB_0018c2ec;
          goto LAB_0018c55f;
        }
        apuStack_7a8[0] = (uv_fs_t *)(ulong)dirents[0].type;
        lStack_7b8 = 1;
        if (apuStack_7a8[0] != (uv_fs_t *)0x1) {
          puStack_7c8 = (uv_fs_t *)0x18c55a;
          run_test_fs_readdir_non_empty_dir_cold_11();
          goto LAB_0018c55a;
        }
LAB_0018c2ec:
        apuStack_7a8[0] = (uv_fs_t *)(ulong)dirents[0].type;
        puStack_7c8 = (uv_fs_t *)0x18c2f4;
        uv_fs_req_cleanup(&readdir_req);
        lVar6 = lVar6 + 1;
        puStack_7c8 = (uv_fs_t *)0x18c2fc;
        uVar2 = uv_default_loop();
        puStack_7c8 = (uv_fs_t *)0x18c30c;
        iVar1 = uv_fs_readdir(uVar2,&readdir_req,puVar3,0);
      } while (iVar1 != 0);
    }
    apuStack_7a8[0] = (uv_fs_t *)0x3;
    lStack_7b8 = lVar6;
    if (lVar6 != 3) goto LAB_0018c621;
    puStack_7c8 = (uv_fs_t *)0x18c33e;
    uv_fs_req_cleanup(&readdir_req);
    puStack_7c8 = (uv_fs_t *)0x18c357;
    memset(&closedir_req,0xdb,0x1c0);
    puStack_7c8 = (uv_fs_t *)0x18c35c;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c36c;
    uv_fs_closedir(uVar2,&closedir_req,puVar3,0);
    apuStack_7a8[0] = (uv_fs_t *)closedir_req.result;
    lStack_7b8 = 0;
    if (closedir_req.result != 0) goto LAB_0018c630;
    puStack_7c8 = (uv_fs_t *)0x18c39d;
    uv_fs_req_cleanup(&closedir_req);
    puVar3 = &opendir_req;
    puStack_7c8 = (uv_fs_t *)0x18c3b6;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_7c8 = (uv_fs_t *)0x18c3bb;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c3d4;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c63f;
    apuStack_7a8[0] = (uv_fs_t *)(long)non_empty_opendir_cb_count;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c64e;
    apuStack_7a8[0] = (uv_fs_t *)(long)non_empty_closedir_cb_count;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c65d;
    puStack_7c8 = (uv_fs_t *)0x18c443;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c44d;
    iVar1 = uv_run(uVar2,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c66c;
    apuStack_7a8[0] = (uv_fs_t *)0x1;
    lStack_7b8 = (long)non_empty_opendir_cb_count;
    if (lStack_7b8 != 1) goto LAB_0018c67b;
    apuStack_7a8[0] = (uv_fs_t *)0x1;
    lStack_7b8 = (long)non_empty_closedir_cb_count;
    if (lStack_7b8 == 1) {
      puStack_7c8 = (uv_fs_t *)0x18c4bc;
      uVar2 = uv_default_loop();
      puStack_7c8 = (uv_fs_t *)0x18c4d5;
      uv_fs_rmdir(uVar2,apuStack_7a8,"test_subdir",0);
      puStack_7c8 = (uv_fs_t *)0x18c4dd;
      uv_fs_req_cleanup(apuStack_7a8);
      puStack_7c8 = (uv_fs_t *)0x18c4e2;
      cleanup_test_files();
      puStack_7c8 = (uv_fs_t *)0x18c4e7;
      puVar3 = (uv_fs_t *)uv_default_loop();
      puStack_7c8 = (uv_fs_t *)0x18c4fb;
      uv_walk(puVar3,close_walk_cb,0);
      puStack_7c8 = (uv_fs_t *)0x18c505;
      uv_run(puVar3,0);
      lStack_7b8 = 0;
      puStack_7c8 = (uv_fs_t *)0x18c513;
      uVar2 = uv_default_loop();
      puStack_7c8 = (uv_fs_t *)0x18c51b;
      iVar1 = uv_loop_close(uVar2);
      lStack_7b0 = (long)iVar1;
      if (lStack_7b8 == lStack_7b0) {
        puStack_7c8 = (uv_fs_t *)0x18c537;
        uv_library_shutdown();
        return;
      }
      goto LAB_0018c699;
    }
  }
  else {
LAB_0018c56e:
    puStack_7c8 = (uv_fs_t *)0x18c580;
    run_test_fs_readdir_non_empty_dir_cold_1();
LAB_0018c580:
    puVar5 = puVar3;
    puStack_7c8 = (uv_fs_t *)0x18c592;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0018c592:
    puStack_7c8 = (uv_fs_t *)0x18c5a4;
    run_test_fs_readdir_non_empty_dir_cold_24();
LAB_0018c5a4:
    puStack_7c8 = (uv_fs_t *)0x18c5b3;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0018c5b3:
    puStack_7c8 = (uv_fs_t *)0x18c5c2;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0018c5c2:
    puStack_7c8 = (uv_fs_t *)0x18c5d1;
    run_test_fs_readdir_non_empty_dir_cold_23();
LAB_0018c5d1:
    puStack_7c8 = (uv_fs_t *)0x18c5e0;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0018c5e0:
    puStack_7c8 = (uv_fs_t *)0x18c5ef;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0018c5ef:
    puStack_7c8 = (uv_fs_t *)0x18c5fe;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0018c5fe:
    puStack_7c8 = (uv_fs_t *)0x18c60d;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0018c60d:
    puVar3 = puVar5;
    puStack_7c8 = (uv_fs_t *)0x18c61c;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0018c61c:
    puStack_7c8 = (uv_fs_t *)0x18c621;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0018c621:
    puStack_7c8 = (uv_fs_t *)0x18c630;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0018c630:
    puStack_7c8 = (uv_fs_t *)0x18c63f;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0018c63f:
    puStack_7c8 = (uv_fs_t *)0x18c64e;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0018c64e:
    puStack_7c8 = (uv_fs_t *)0x18c65d;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0018c65d:
    puStack_7c8 = (uv_fs_t *)0x18c66c;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0018c66c:
    puStack_7c8 = (uv_fs_t *)0x18c67b;
    run_test_fs_readdir_non_empty_dir_cold_18();
LAB_0018c67b:
    puStack_7c8 = (uv_fs_t *)0x18c68a;
    run_test_fs_readdir_non_empty_dir_cold_19();
  }
  puStack_7c8 = (uv_fs_t *)0x18c699;
  run_test_fs_readdir_non_empty_dir_cold_20();
LAB_0018c699:
  puStack_7c8 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_21();
  puStack_7c8 = puVar3;
  uv_fs_unlink(0,auStack_988,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_988);
  uv_fs_unlink(0,auStack_988,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_988);
  uv_fs_rmdir(0,auStack_988,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_988);
  uv_fs_rmdir(0,auStack_988,"test_dir",0);
  uv_fs_req_cleanup(auStack_988);
  return;
}

Assistant:

static void empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_OK(req->result);
  ASSERT_NOT_NULL(req->ptr);
  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    empty_readdir_cb);
  ASSERT_OK(r);
  uv_fs_req_cleanup(req);
  ++empty_opendir_cb_count;
}